

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O3

FixedFieldInfo * __thiscall
ObjTypeSpecFldInfo::GetFixedFieldIfAvailableAsFixedFunction(ObjTypeSpecFldInfo *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  FixedFieldIDL *pFVar5;
  
  uVar3._0_2_ = (this->m_data).flags;
  uVar3._2_2_ = (this->m_data).slotIndex;
  if ((uVar3 >> 8 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x13f,"(HasFixedValue())","HasFixedValue()");
    if (!bVar2) goto LAB_0060e11b;
    *puVar4 = 0;
    uVar3 = (uint)(this->m_data).flags;
  }
  if ((~uVar3 & 0x1002) == 0) {
    pFVar5 = (FixedFieldIDL *)0x0;
  }
  else {
    if ((this->m_data).fixedFieldInfoArraySize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x144,"(m_data.fixedFieldInfoArraySize > 0)",
                         "m_data.fixedFieldInfoArraySize > 0");
      if (!bVar2) goto LAB_0060e11b;
      *puVar4 = 0;
    }
    pFVar5 = (this->m_data).fixedFieldInfoArray.ptr;
    if (pFVar5 == (FixedFieldIDL *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x145,"(GetFixedFieldInfoArray())","GetFixedFieldInfoArray()");
      if (!bVar2) {
LAB_0060e11b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      pFVar5 = (this->m_data).fixedFieldInfoArray.ptr;
    }
    pFVar5 = (FixedFieldIDL *)FixedFieldInfo::GetFuncInfoAddr((FixedFieldInfo *)pFVar5);
    if (pFVar5 != (FixedFieldIDL *)0x0) {
      pFVar5 = (this->m_data).fixedFieldInfoArray.ptr;
    }
  }
  return (FixedFieldInfo *)pFVar5;
}

Assistant:

FixedFieldInfo *
ObjTypeSpecFldInfo::GetFixedFieldIfAvailableAsFixedFunction()
{
    Assert(HasFixedValue());
    if (!IsMono() && !(IsPoly() && !DoesntHaveEquivalence()))
    {
        return nullptr;
    }
    AssertOrFailFast(m_data.fixedFieldInfoArraySize > 0);
    Assert(GetFixedFieldInfoArray());
    if (GetFixedFieldInfoArray()[0].GetFuncInfoAddr() != 0)
    {
        return &GetFixedFieldInfoArray()[0];
    }
    return nullptr;
}